

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::IsClosed(ON_PolyCurve *this)

{
  ON_Curve *pOVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (iVar3 == 1) {
    pOVar1 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar1 != (ON_Curve *)0x0) {
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      return SUB41(iVar3,0);
    }
  }
  else if ((1 < iVar3) && (bVar2 = ON_Curve::IsClosed(&this->super_ON_Curve), bVar2)) {
    iVar3 = FindNextGap(this,0);
    return iVar3 == 0;
  }
  return false;
}

Assistant:

bool 
ON_PolyCurve::IsClosed() const
{
  bool bIsClosed = false;
  const int count = Count();
  if ( count == 1 ) {
    // evaluation test required
    const ON_Curve* c = FirstSegmentCurve();
    if ( c )
      bIsClosed = c->IsClosed();
  }
  else if ( count > 1 ) 
  {
    // 17 May2005 Dale Lear 
    //  I added the FindNextGap(0) <= 0 test to
    //  prevent discontinuous curves from being
    //  classified as closed.
    bIsClosed = ( ON_Curve::IsClosed() && FindNextGap(0) <= 0 );
  }
  return bIsClosed;
}